

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_extra.c
# Opt level: O1

char * nsync_time_str(nsync_time t,int decimals)

{
  double dVar1;
  ulong uVar2;
  char *pcVar3;
  double *pdVar4;
  double dVar5;
  
  dVar5 = (double)t.tv_nsec * 1e-09 + (double)t.tv_sec;
  uVar2 = 0xffffffffffffffff;
  pdVar4 = &nsync_time_str::scale[1].multiplier;
  do {
    if (uVar2 == 3) {
      uVar2 = 4;
      break;
    }
    uVar2 = uVar2 + 1;
    dVar1 = *pdVar4;
    pdVar4 = pdVar4 + 2;
  } while (dVar1 <= dVar5);
  pcVar3 = smprintf("%.*f%s",dVar5 / nsync_time_str::scale[uVar2 & 0xffffffff].multiplier,
                    (ulong)(uint)decimals,nsync_time_str::scale[uVar2 & 0xffffffff].suffix);
  return pcVar3;
}

Assistant:

NSYNC_CPP_USING_

char *nsync_time_str (nsync_time t, int decimals) {
	static const struct {
		const char *suffix;
		double multiplier;
	} scale[] = {
		{ "ns", 1.0e-9, },
		{ "us", 1e-6, },
		{ "ms", 1e-3, },
		{ "s", 1.0, },
		{ "hr", 3600.0, },
	};
        double s = nsync_time_to_dbl (t);
	int i = 0;
	while (i + 1 != sizeof (scale) / sizeof (scale[0]) && scale[i + 1].multiplier <= s) {
		i++;
	}
	return (smprintf ("%.*f%s", decimals, s/scale[i].multiplier, scale[i].suffix));
}